

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall
llvm::detail::DoubleAPFloat::DoubleAPFloat(DoubleAPFloat *this,fltSemantics *S,APInt *I)

{
  undefined8 *puVar1;
  uint64_t *puVar2;
  APInt local_40;
  APInt local_30;
  APInt *local_20;
  APInt *I_local;
  fltSemantics *S_local;
  DoubleAPFloat *this_local;
  
  this->Semantics = S;
  local_20 = I;
  I_local = (APInt *)S;
  S_local = (fltSemantics *)this;
  puVar1 = (undefined8 *)operator_new__(0x48);
  *puVar1 = 2;
  puVar2 = APInt::getRawData(local_20);
  APInt::APInt(&local_30,0x40,*puVar2,false);
  APFloat::APFloat((APFloat *)(puVar1 + 1),(fltSemantics *)semIEEEdouble,&local_30);
  puVar2 = APInt::getRawData(local_20);
  APInt::APInt(&local_40,0x40,puVar2[1],false);
  APFloat::APFloat((APFloat *)(puVar1 + 5),(fltSemantics *)semIEEEdouble,&local_40);
  std::unique_ptr<llvm::APFloat[],std::default_delete<llvm::APFloat[]>>::
  unique_ptr<llvm::APFloat*,std::default_delete<llvm::APFloat[]>,void,bool>
            ((unique_ptr<llvm::APFloat[],std::default_delete<llvm::APFloat[]>> *)&this->Floats,
             (APFloat *)(puVar1 + 1));
  APInt::~APInt(&local_40);
  APInt::~APInt(&local_30);
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xf21,
                "llvm::detail::DoubleAPFloat::DoubleAPFloat(const fltSemantics &, const APInt &)");
}

Assistant:

DoubleAPFloat::DoubleAPFloat(const fltSemantics &S, const APInt &I)
    : Semantics(&S),
      Floats(new APFloat[2]{
          APFloat(semIEEEdouble, APInt(64, I.getRawData()[0])),
          APFloat(semIEEEdouble, APInt(64, I.getRawData()[1]))}) {
  assert(Semantics == &semPPCDoubleDouble);
}